

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::addChild<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          Data2D<int> *destination)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  int local_64;
  int i;
  int max_1d_kids;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> kid;
  Data2D<int> *destination_local;
  MultiIndexSet *exclude_local;
  int direction_local;
  int *point_local;
  GridLocalPolynomial *this_local;
  
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)destination;
  ::std::allocator<int>::allocator(&local_49);
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_48,point,point + iVar2,&local_49);
  ::std::allocator<int>::~allocator(&local_49);
  iVar2 = RuleLocal::getMaxNumKids<(TasGrid::RuleLocal::erule)2>();
  for (local_64 = 0; local_64 < iVar2; local_64 = local_64 + 1) {
    iVar3 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)2>(point[direction],local_64);
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)direction);
    *pvVar4 = iVar3;
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)direction);
    if ((*pvVar4 != -1) &&
       (bVar1 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)local_48), bVar1
       )) {
      Data2D<int>::appendStrip
                ((Data2D<int> *)
                 kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_48);
    }
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void GridLocalPolynomial::addChild(const int point[], int direction, const MultiIndexSet &exclude, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    for(int i=0; i<max_1d_kids; i++){
        kid[direction] = RuleLocal::getKid<effrule>(point[direction], i);
        if ((kid[direction] != -1) && exclude.missing(kid)){
            destination.appendStrip(kid);
        }
    }
}